

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  uint parsed_major;
  char buf [64];
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  PolicyPushPop polScope;
  string local_c8;
  undefined1 local_a8 [32];
  _WordT local_88;
  string *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  cmMakefile *local_48;
  PolicyPushPop local_40;
  
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_60 = result_version;
  cmMakefile::PushScope(pcVar3);
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = 0;
  local_88 = 0;
  local_48 = pcVar3;
  cmMakefile::PolicyPushPop::PolicyPushPop
            (&local_40,(this->super_cmFindCommon).super_cmCommand.Makefile,false,
             (PolicyMap *)local_a8);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"PACKAGE_VERSION","");
  cmMakefile::RemoveDefinition(pcVar3,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"PACKAGE_VERSION_UNSUITABLE","");
  cmMakefile::RemoveDefinition(pcVar3,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"PACKAGE_VERSION_COMPATIBLE","");
  cmMakefile::RemoveDefinition(pcVar3,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"PACKAGE_VERSION_EXACT","");
  cmMakefile::RemoveDefinition(pcVar3,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"PACKAGE_FIND_NAME","");
  cmMakefile::AddDefinition(pcVar3,(string *)local_a8,(this->Name)._M_dataplus._M_p);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"PACKAGE_FIND_VERSION","");
  cmMakefile::AddDefinition(pcVar3,(string *)local_a8,(this->Version)._M_dataplus._M_p);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  sprintf(local_a8,"%u",(ulong)this->VersionMajor);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"PACKAGE_FIND_VERSION_MAJOR","");
  cmMakefile::AddDefinition(pcVar3,&local_c8,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_a8,"%u",(ulong)this->VersionMinor);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"PACKAGE_FIND_VERSION_MINOR","");
  cmMakefile::AddDefinition(pcVar3,&local_c8,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_a8,"%u",(ulong)this->VersionPatch);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"PACKAGE_FIND_VERSION_PATCH","");
  cmMakefile::AddDefinition(pcVar3,&local_c8,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_a8,"%u",(ulong)this->VersionTweak);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"PACKAGE_FIND_VERSION_TWEAK","");
  cmMakefile::AddDefinition(pcVar3,&local_c8,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  sprintf(local_a8,"%u",(ulong)this->VersionCount);
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"PACKAGE_FIND_VERSION_COUNT","");
  cmMakefile::AddDefinition(pcVar3,&local_c8,local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  bVar6 = ReadListFile(this,(version_file->_M_dataplus)._M_p,NoPolicyScope);
  if (bVar6) {
    pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"PACKAGE_VERSION_EXACT","");
    bVar7 = cmMakefile::IsOn(pcVar3,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"PACKAGE_VERSION_UNSUITABLE","");
    bVar6 = cmMakefile::IsOn(pcVar3,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar7) && (this->VersionExact == false)) {
      pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_c8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"PACKAGE_VERSION_COMPATIBLE","");
      bVar7 = cmMakefile::IsOn(pcVar3,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar7 == false && !bVar6) {
      bVar6 = (this->Version)._M_string_length == 0;
    }
    else {
      bVar6 = !bVar6;
    }
    if (bVar6 != false) {
      pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_c8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"PACKAGE_VERSION","");
      pcVar9 = cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
      pcVar4 = (char *)(this->VersionFound)._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&this->VersionFound,0,pcVar4,(ulong)pcVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      uVar8 = __isoc99_sscanf((this->VersionFound)._M_dataplus._M_p,"%u.%u.%u.%u",&local_c8,
                              &local_4c,&local_50,&local_54);
      this->VersionFoundCount = uVar8;
      switch(uVar8) {
      case 4:
        this->VersionFoundTweak = local_54;
      case 3:
        this->VersionFoundPatch = local_50;
      case 2:
        this->VersionFoundMinor = local_4c;
      case 1:
        this->VersionFoundMajor = (uint)local_c8._M_dataplus._M_p;
      }
    }
  }
  else {
    bVar6 = false;
  }
  pcVar3 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"PACKAGE_VERSION","");
  pcVar9 = cmMakefile::GetSafeDefinition(pcVar3,&local_c8);
  psVar5 = local_60;
  pcVar4 = (char *)local_60->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar4,(ulong)pcVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_60->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)local_60,0,(char *)0x0,0x4f85d4);
  }
  cmMakefile::PolicyPushPop::~PolicyPushPop(&local_40);
  cmMakefile::PopScope(local_48);
  return bVar6;
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name.c_str());
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION",
                                this->Version.c_str());
  char buf[64];
  sprintf(buf, "%u", this->VersionMajor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MAJOR", buf);
  sprintf(buf, "%u", this->VersionMinor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MINOR", buf);
  sprintf(buf, "%u", this->VersionPatch);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_PATCH", buf);
  sprintf(buf, "%u", this->VersionTweak);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_TWEAK", buf);
  sprintf(buf, "%u", this->VersionCount);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COUNT", buf);

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if(this->ReadListFile(version_file.c_str(), NoPolicyScope))
    {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if(!okay && !this->VersionExact)
      {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
      }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if(suitable)
      {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        sscanf(this->VersionFound.c_str(), "%u.%u.%u.%u",
               &parsed_major, &parsed_minor,
               &parsed_patch, &parsed_tweak);
      switch(this->VersionFoundCount)
        {
        case 4: this->VersionFoundTweak = parsed_tweak; // no break!
        case 3: this->VersionFoundPatch = parsed_patch; // no break!
        case 2: this->VersionFoundMinor = parsed_minor; // no break!
        case 1: this->VersionFoundMajor = parsed_major; // no break!
        default: break;
        }
      }
    }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty())
    {
    result_version = "unknown";
    }

  // Succeed if the version is suitable.
  return suitable;
}